

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

string * __thiscall
pbrt::PiecewiseConstant1D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseConstant1D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ PiecewiseConstant1D func: %s cdf: %s min: %f max: %f funcInt: %f ]",&this->func,
             &this->cdf,&this->min,&this->max,&this->funcInt);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ PiecewiseConstant1D func: %s cdf: %s "
                            "min: %f max: %f funcInt: %f ]",
                            func, cdf, min, max, funcInt);
    }